

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O1

int cpu_exec_sparc64(uc_struct_conflict9 *uc,CPUState *cpu)

{
  uc_struct_conflict7 *puVar1;
  void *pvVar2;
  CPUWatchpoint *pCVar3;
  CPUClass *pCVar4;
  target_ulong cs_base;
  long lVar5;
  void *pvVar6;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var7;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var8;
  vaddr vVar9;
  _Bool _Var10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  TranslationBlock *pTVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  TranslationBlock *pTVar19;
  TranslationBlock *pTVar20;
  uint cf_mask;
  uint32_t cflags;
  CPUClass *pCVar21;
  TranslationBlock *pTVar22;
  TranslationBlock_conflict *pTVar23;
  uc_struct_conflict9 *puVar24;
  list_item *plVar25;
  bool bVar26;
  uc_tb cur_tb;
  target_ulong local_50;
  uint16_t local_48;
  uint16_t local_46;
  target_ulong local_40;
  uint16_t local_38;
  uint16_t local_36;
  
  pCVar21 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar21->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var10 = (*pCVar21->has_work)((CPUState_conflict *)cpu);
    if (!_Var10) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar21->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar12 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  puVar24 = uc;
  if (iVar12 != 0) {
    pCVar21 = cpu->cc;
  }
  do {
    uVar17 = (uint)puVar24;
    puVar1 = cpu->uc;
    if ((puVar1->stop_interrupt == (uc_args_int_t_conflict7)0x0) ||
       (_Var10 = (*puVar1->stop_interrupt)(puVar1,cpu->exception_index), !_Var10)) {
      uVar18 = cpu->exception_index;
      if ((int)uVar18 < 0) {
        bVar26 = false;
      }
      else if ((int)uVar18 < 0x10000) {
        bVar26 = false;
        for (plVar25 = puVar1->hook[0].head;
            (plVar25 != (list_item *)0x0 && (pvVar2 = plVar25->data, pvVar2 != (void *)0x0));
            plVar25 = plVar25->next) {
          if (*(char *)((long)pvVar2 + 0x14) == '\0') {
            (**(code **)((long)pvVar2 + 0x28))
                      (puVar1,cpu->exception_index,*(undefined8 *)((long)pvVar2 + 0x30));
            bVar26 = true;
          }
        }
        if (bVar26) {
          cpu->exception_index = -1;
          uVar17 = 0x10000;
        }
        else {
          puVar1->invalid_error = 0x15;
          cpu->halted = 1;
          uVar17 = 0x10001;
        }
        bVar26 = (bool)(bVar26 ^ 1);
      }
      else {
        if (uVar18 == 0x10002) {
          pCVar4 = cpu->cc;
          if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
            for (pCVar3 = (cpu->watchpoints).tqh_first; pCVar3 != (CPUWatchpoint *)0x0;
                pCVar3 = (pCVar3->entry).tqe_next) {
              *(byte *)&pCVar3->flags = (byte)pCVar3->flags & 0x3f;
            }
          }
          (*pCVar4->debug_excp_handler)((CPUState_conflict *)cpu);
        }
        cpu->exception_index = -1;
        bVar26 = true;
        uVar17 = uVar18;
      }
    }
    else {
      plVar25 = puVar1->hook[0xe].head;
      if (plVar25 == (list_item *)0x0) {
LAB_00a40472:
        puVar1->invalid_error = 10;
      }
      else {
        bVar11 = 0;
        while (pvVar2 = plVar25->data, pvVar2 != (void *)0x0) {
          if (((*(char *)((long)pvVar2 + 0x14) == '\0') &&
              (bVar11 = (**(code **)((long)pvVar2 + 0x28))
                                  (puVar1,*(undefined8 *)((long)pvVar2 + 0x30)), bVar11 != 0)) ||
             (plVar25 = plVar25->next, plVar25 == (list_item *)0x0)) break;
        }
        if ((bVar11 & 1) == 0) goto LAB_00a40472;
      }
      bVar26 = true;
      uVar17 = 0x10001;
    }
    if (bVar26) {
      uc->cpu->tcg_exit_req = 0;
      (*pCVar21->cpu_exec_exit)((CPUState_conflict *)cpu);
      return uVar17;
    }
    pTVar20 = (TranslationBlock *)0x0;
    pTVar19 = pTVar20;
LAB_00a4057d:
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0xf9a) = 0;
    uVar18 = cpu->interrupt_request;
    if (uVar18 == 0) {
LAB_00a40598:
      if (cpu->exit_request == true) {
        cpu->exit_request = false;
        bVar26 = true;
        if (cpu->exception_index == -1) {
          cpu->exception_index = 0x10000;
        }
      }
      else {
        bVar26 = false;
      }
    }
    else {
      uVar13 = uVar18;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar13 = uVar18 & 0xffffeda5;
      }
      if ((char)uVar13 < '\0') {
        cpu->interrupt_request = uVar18 & 0xffffff7f;
        cpu->exception_index = 0x10002;
      }
      else {
        if ((uVar13 >> 10 & 1) == 0) {
          _Var10 = (*pCVar4->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar13);
          if (_Var10) {
            cpu->exception_index = -1;
            pTVar19 = (TranslationBlock *)0x0;
          }
          if ((cpu->interrupt_request & 4) != 0) {
            cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
            pTVar19 = (TranslationBlock *)0x0;
          }
          goto LAB_00a40598;
        }
        cpu_reset(cpu);
      }
      bVar26 = true;
    }
    if (!bVar26) {
      cflags = cpu->cflags_next_tb;
      if (cflags == 0xffffffff) {
        cflags = 0;
      }
      else {
        cpu->cflags_next_tb = 0xffffffff;
      }
      pvVar2 = cpu->env_ptr;
      uVar15 = *(ulong *)((long)pvVar2 + 0x48);
      cs_base = *(target_ulong *)((long)pvVar2 + 0x50);
      uVar18 = 5;
      if ((((*(byte *)((long)pvVar2 + 0x1208) & 8) != 0) &&
          (((*(byte *)((long)pvVar2 + 0x20b1) & 8) == 0 ||
           ((*(byte *)((long)pvVar2 + 0x1fa0) & 4) == 0)))) &&
         (uVar18 = 4, *(int *)((long)pvVar2 + 0x1c4c) == 0)) {
        uVar18 = *(uint *)((long)pvVar2 + 0x1c48) >> 1 & 2;
      }
      uVar13 = *(uint *)((long)pvVar2 + 0x1c48);
      uVar18 = ((uVar13 & 4) << 4 | uVar18) + (uVar13 & 8) * 4;
      if ((uVar13 & 0x10) != 0 && (*(byte *)((long)pvVar2 + 0x20b0) & 1) != 0) {
        uVar18 = uVar18 + (*(uint *)((long)pvVar2 + 0x1f68) & 4) * 4;
      }
      puVar1 = cpu->uc;
      uVar18 = *(int *)((long)pvVar2 + 0x1c44) << 0x18 | uVar18;
      uVar13 = (uint)(uVar15 >> 7) ^ (uint)uVar15;
      uVar13 = uVar13 & 0x3f | uVar13 >> 7 & 0xfc0;
      pTVar14 = cpu->tb_jmp_cache[uVar13];
      cf_mask = cpu->cluster_index << 0x18 | cflags & 0xffffff;
      if (((pTVar14 == (TranslationBlock *)0x0) || (pTVar14->pc != uVar15)) ||
         ((pTVar14->cs_base != cs_base ||
          (((pTVar14->flags != uVar18 || (cpu->trace_dstate[0] != (ulong)pTVar14->trace_vcpu_dstate)
            ) || ((pTVar14->cflags & 0xff0effff) != cf_mask)))))) {
        pTVar14 = tb_htable_lookup_sparc64(cpu,uVar15,cs_base,uVar18,cf_mask);
        if (pTVar14 == (TranslationBlock *)0x0) {
          pTVar14 = (TranslationBlock *)0x0;
        }
        else {
          cpu->tb_jmp_cache[uVar13] = pTVar14;
        }
      }
      if (pTVar14 == (TranslationBlock *)0x0) {
        pTVar14 = tb_gen_code_sparc64(cpu,uVar15,cs_base,uVar18,cflags);
        cpu->tb_jmp_cache[uVar13] = pTVar14;
        pTVar22 = puVar1->last_tb;
        if (pTVar22 != (TranslationBlock *)0x0) {
          local_40 = pTVar14->pc;
          local_38 = pTVar14->icount;
          local_36 = pTVar14->size;
          local_50 = pTVar22->pc;
          local_48 = pTVar22->icount;
          local_46 = pTVar22->size;
          for (plVar25 = puVar1->hook[0xf].head;
              (plVar25 != (list_item *)0x0 && (pvVar2 = plVar25->data, pvVar2 != (void *)0x0));
              plVar25 = plVar25->next) {
            if (*(char *)((long)pvVar2 + 0x14) == '\0') {
              if (((*(ulong *)((long)pvVar2 + 0x18) <= pTVar14->pc) &&
                  (pTVar14->pc <= *(ulong *)((long)pvVar2 + 0x20))) ||
                 (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) {
                (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,&local_40,&local_50,*(undefined8 *)((long)pvVar2 + 0x30));
              }
            }
          }
        }
      }
      if ((pTVar19 != (TranslationBlock *)0x0) && (pTVar14->page_addr[1] == 0xffffffffffffffff)) {
        if (1 < (uint)pTVar20) {
          __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                        ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
        }
        if ((pTVar14->cflags & 0x40000) == 0) {
          LOCK();
          bVar26 = pTVar19->jmp_dest[(long)pTVar20] == 0;
          if (bVar26) {
            pTVar19->jmp_dest[(long)pTVar20] = (uintptr_t)pTVar14;
          }
          UNLOCK();
          if (bVar26) {
            pvVar2 = (pTVar19->tc).ptr;
            *(int *)(pTVar19->jmp_target_arg[(long)pTVar20] + (long)pvVar2) =
                 (*(int *)&(pTVar14->tc).ptr -
                 ((int)pTVar19->jmp_target_arg[(long)pTVar20] + (int)pvVar2)) + -4;
            pTVar19->jmp_list_next[(long)pTVar20] = pTVar14->jmp_list_head;
            pTVar14->jmp_list_head = (ulong)pTVar19 | (ulong)pTVar20;
          }
        }
      }
      if (cpu->exit_request == false) {
        pvVar2 = cpu->env_ptr;
        tb_exec_lock_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx);
        uVar15 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x20d8) + 0x2e8) + 0x90))(pvVar2);
        if (cpu->uc->nested_level == 1) {
          tb_exec_unlock_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx);
        }
        cpu->can_do_io = 1;
        pTVar22 = (TranslationBlock *)(uVar15 & 0xfffffffffffffffc);
        if ((uVar15 & 2) != 0) {
          if (*(long *)(*(long *)((long)pvVar2 + 0x20d8) + 0x358) == 0) {
            uVar18 = *(uint *)(*(long *)((long)pvVar2 + 0x20d8) + 0x578);
            if (((0x12 < uVar18) || ((0x771c0U >> (uVar18 & 0x1f) & 1) == 0)) &&
               (cpu->uc->quit_request == false)) {
              p_Var7 = cpu->cc->synchronize_from_tb;
              if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                p_Var8 = cpu->cc->set_pc;
                if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_00a40c13;
                (*p_Var8)((CPUState_conflict *)cpu,pTVar22->pc);
              }
              else {
                (*p_Var7)((CPUState_conflict *)cpu,(TranslationBlock_conflict *)pTVar22);
              }
            }
          }
          cpu->tcg_exit_req = 0;
        }
        cpu->uc->last_tb = pTVar14;
        uVar18 = (uint)uVar15 & 3;
        pTVar20 = (TranslationBlock *)(ulong)uVar18;
        pTVar19 = pTVar22;
        if (uVar18 == 3) {
          pTVar19 = (TranslationBlock *)0x0;
          pTVar20 = (TranslationBlock *)0x3;
          if (-1 < *(int *)(cpu[1].tb_jmp_cache + 499)) {
            lVar5 = cpu->icount_budget;
            lVar16 = 0xffff;
            if (lVar5 < 0xffff) {
              lVar16 = lVar5;
            }
            uVar18 = (uint)lVar16;
            *(short *)(cpu[1].tb_jmp_cache + 499) = (short)lVar16;
            cpu->icount_extra = lVar5 - (int)uVar18;
            pTVar19 = (TranslationBlock *)0x0;
            pTVar20 = (TranslationBlock *)0x3;
            if (0 < (int)uVar18 && lVar5 - (int)uVar18 == 0) {
              uVar13 = 0x7fff;
              if ((int)uVar18 < 0x7fff) {
                uVar13 = uVar18;
              }
              pTVar19 = tb_gen_code_sparc64(cpu,pTVar22->pc,pTVar22->cs_base,pTVar22->flags,
                                            uVar13 | 0x10000);
              pTVar19->orig_tb = pTVar22;
              pvVar2 = cpu->env_ptr;
              pvVar6 = (pTVar19->tc).ptr;
              tb_exec_lock_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx);
              uVar15 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x20d8) + 0x2e8) + 0x90))
                                 (pvVar2,pvVar6);
              if (cpu->uc->nested_level == 1) {
                tb_exec_unlock_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx);
              }
              cpu->can_do_io = 1;
              if ((uVar15 & 2) != 0) {
                if (*(long *)(*(long *)((long)pvVar2 + 0x20d8) + 0x358) == 0) {
                  uVar18 = *(uint *)(*(long *)((long)pvVar2 + 0x20d8) + 0x578);
                  if (((0x12 < uVar18) || ((0x771c0U >> (uVar18 & 0x1f) & 1) == 0)) &&
                     (cpu->uc->quit_request == false)) {
                    pTVar23 = (TranslationBlock_conflict *)(uVar15 & 0xfffffffffffffffc);
                    p_Var7 = cpu->cc->synchronize_from_tb;
                    if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                      p_Var8 = cpu->cc->set_pc;
                      if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_00a40c13:
                        __assert_fail("cc->set_pc",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                      ,0x61,
                                      "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)"
                                     );
                      }
                      vVar9._0_4_ = pTVar23->pc;
                      vVar9._4_4_ = pTVar23->cs_base;
                      (*p_Var8)((CPUState_conflict *)cpu,vVar9);
                    }
                    else {
                      (*p_Var7)((CPUState_conflict *)cpu,pTVar23);
                    }
                  }
                }
                cpu->tcg_exit_req = 0;
              }
              tb_phys_invalidate_sparc64
                        ((TCGContext_conflict8 *)cpu->uc->tcg_ctx,pTVar19,0xffffffffffffffff);
              tcg_tb_remove_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx,pTVar19);
              pTVar19 = (TranslationBlock *)0x0;
              pTVar20 = (TranslationBlock *)0x3;
            }
          }
        }
      }
      goto LAB_00a4057d;
    }
    puVar24 = (uc_struct_conflict9 *)(ulong)uVar17;
  } while( true );
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}